

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlChar * xmlSplitQName(xmlParserCtxtPtr ctxt,xmlChar *name,xmlChar **prefixOut)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  xmlChar *pxVar4;
  ulong uVar5;
  xmlChar *pxVar6;
  xmlChar *pxVar7;
  ulong uVar8;
  int iVar9;
  size_t __n;
  ulong __n_00;
  byte *pbVar10;
  uint uVar11;
  byte bVar12;
  bool bVar13;
  int l;
  xmlChar buf [105];
  int local_ac;
  byte local_a8 [120];
  
  if (prefixOut == (xmlChar **)0x0) {
    return (xmlChar *)0x0;
  }
  *prefixOut = (xmlChar *)0x0;
  if (name == (xmlChar *)0x0) {
    return (xmlChar *)0x0;
  }
  bVar12 = *name;
  if (bVar12 == 0x3a) {
LAB_00130676:
    pxVar4 = xmlStrdup(name);
    return pxVar4;
  }
  uVar5 = 0;
  while ((bVar12 != 0 && (bVar12 != 0x3a))) {
    if (uVar5 == 100) {
      __n = 100;
      goto LAB_001306bf;
    }
    local_a8[uVar5] = bVar12;
    lVar1 = uVar5 + 1;
    uVar5 = uVar5 + 1;
    bVar12 = name[lVar1];
  }
  __n = uVar5 & 0xffffffff;
LAB_001306bf:
  pbVar10 = name + uVar5 + 1;
  if ((uint)__n < 100) {
    pxVar4 = (xmlChar *)0x0;
    uVar5 = 100;
  }
  else {
    uVar5 = (ulong)((uint)__n * 2);
    pxVar4 = (xmlChar *)(*xmlMalloc)(uVar5);
    if (pxVar4 == (xmlChar *)0x0) goto LAB_001308a8;
    memcpy(pxVar4,local_a8,__n);
    while ((bVar12 != 0 && (bVar12 != 0x3a))) {
      iVar3 = (int)uVar5;
      if (iVar3 < (int)__n + 10) {
        uVar2 = 1;
        if ((0 < iVar3) && (uVar2 = 0xffffffff, iVar3 < 1000000000)) {
          uVar11 = iVar3 + 1U >> 1;
          uVar2 = uVar11 + iVar3;
          if ((int)(1000000000 - uVar11) < iVar3) {
            uVar2 = 1000000000;
          }
        }
        if (((int)uVar2 < 0) ||
           (pxVar6 = (xmlChar *)(*xmlRealloc)(pxVar4,(ulong)uVar2), pxVar6 == (xmlChar *)0x0)) {
          xmlCtxtErrMemory(ctxt);
          (*xmlFree)(pxVar4);
          bVar13 = false;
        }
        else {
          bVar13 = true;
          uVar5 = (ulong)uVar2;
          pxVar4 = pxVar6;
        }
        if (!bVar13) {
          return (xmlChar *)0x0;
        }
      }
      pxVar4[__n] = bVar12;
      __n = __n + 1;
      bVar12 = *pbVar10;
      pbVar10 = pbVar10 + 1;
    }
    pxVar4[__n & 0xffffffff] = '\0';
  }
  if ((bVar12 == 0x3a) && (*pbVar10 == 0)) {
    if (pxVar4 != (xmlChar *)0x0) {
      (*xmlFree)(pxVar4);
    }
    goto LAB_00130676;
  }
  uVar8 = 100;
  if ((pxVar4 == (xmlChar *)0x0) &&
     (pxVar4 = xmlStrndup(local_a8,(int)__n), uVar8 = uVar5, pxVar4 == (xmlChar *)0x0)) {
LAB_001308a8:
    xmlCtxtErrMemory(ctxt);
    return (xmlChar *)0x0;
  }
  if (bVar12 != 0x3a) {
    return pxVar4;
  }
  bVar12 = *pbVar10;
  if (bVar12 == 0) {
    pxVar6 = xmlStrndup("",0);
    if (pxVar6 != (xmlChar *)0x0) {
      *prefixOut = pxVar4;
      return pxVar6;
    }
    goto LAB_00130b21;
  }
  if (((0x19 < (byte)((bVar12 & 0xdf) + 0xbf)) && (bVar12 != 0x3a)) && (bVar12 != 0x5f)) {
    uVar2 = xmlStringCurrentChar(ctxt,pbVar10,&local_ac);
    if ((int)uVar2 < 0x100) {
      if (((0x16 < uVar2 - 0xc0) && (0x19 < (uVar2 & 0xffffffdf) - 0x41)) &&
         ((int)uVar2 < 0xf8 && 0x1e < uVar2 - 0xd8)) {
LAB_00130907:
        if ((int)uVar2 < 0x100) {
          if (uVar2 != 0x5f) {
LAB_0013093f:
            xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_NS_ERR_QNAME,XML_ERR_FATAL,name,
                       (xmlChar *)0x0,(xmlChar *)0x0,0,"Name %s is not XML Namespace compliant\n",
                       name);
          }
        }
        else if ((uVar2 - 0x302a < 0xfffffff7 && uVar2 - 0x9fa6 < 0xffffae5a) && uVar2 != 0x3007)
        goto LAB_0013093f;
      }
    }
    else {
      iVar3 = xmlCharInRange(uVar2,&xmlIsBaseCharGroup);
      if (iVar3 == 0) goto LAB_00130907;
    }
  }
  pbVar10 = pbVar10 + 1;
  bVar13 = 0 < (int)uVar8;
  if ((int)uVar8 < 1) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    do {
      local_a8[uVar5] = bVar12;
      bVar12 = pbVar10[uVar5];
      uVar5 = uVar5 + 1;
      bVar13 = uVar5 < uVar8;
      if (bVar12 == 0) break;
    } while (uVar5 < uVar8);
    pbVar10 = pbVar10 + uVar5;
  }
  iVar3 = (int)uVar5;
  if (bVar13) {
    pxVar6 = (xmlChar *)0x0;
  }
  else {
    uVar8 = (ulong)(uint)(iVar3 * 2);
    pxVar6 = (xmlChar *)(*xmlMalloc)(uVar8);
    if (pxVar6 == (xmlChar *)0x0) {
      xmlCtxtErrMemory(ctxt);
      goto LAB_00130b21;
    }
    __n_00 = uVar5 & 0xffffffff;
    memcpy(pxVar6,local_a8,__n_00);
    while (iVar3 = (int)uVar5, bVar12 != 0) {
      iVar9 = (int)uVar8;
      if (iVar9 < iVar3 + 10) {
        uVar2 = 1;
        if ((0 < iVar9) && (uVar2 = 0xffffffff, iVar9 < 1000000000)) {
          uVar11 = iVar9 + 1U >> 1;
          uVar2 = uVar11 + iVar9;
          if ((int)(1000000000 - uVar11) < iVar9) {
            uVar2 = 1000000000;
          }
        }
        if ((int)uVar2 < 0) {
          xmlCtxtErrMemory(ctxt);
LAB_00130ab8:
          (*xmlFree)(pxVar6);
          bVar13 = false;
        }
        else {
          pxVar7 = (xmlChar *)(*xmlRealloc)(pxVar6,(ulong)uVar2);
          if (pxVar7 == (xmlChar *)0x0) {
            xmlCtxtErrMemory(ctxt);
            (*xmlFree)(pxVar4);
            goto LAB_00130ab8;
          }
          bVar13 = true;
          uVar8 = (ulong)uVar2;
          pxVar6 = pxVar7;
        }
        if (!bVar13) {
          return (xmlChar *)0x0;
        }
      }
      pxVar6[__n_00] = bVar12;
      __n_00 = __n_00 + 1;
      uVar5 = (ulong)(iVar3 + 1);
      bVar12 = *pbVar10;
      pbVar10 = pbVar10 + 1;
    }
    pxVar6[uVar5 & 0xffffffff] = '\0';
  }
  if ((pxVar6 != (xmlChar *)0x0) || (pxVar6 = xmlStrndup(local_a8,iVar3), pxVar6 != (xmlChar *)0x0))
  {
    *prefixOut = pxVar4;
    return pxVar6;
  }
LAB_00130b21:
  (*xmlFree)(pxVar4);
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlSplitQName(xmlParserCtxtPtr ctxt, const xmlChar *name, xmlChar **prefixOut) {
    xmlChar buf[XML_MAX_NAMELEN + 5];
    xmlChar *buffer = NULL;
    int len = 0;
    int max = XML_MAX_NAMELEN;
    xmlChar *ret = NULL;
    xmlChar *prefix;
    const xmlChar *cur = name;
    int c;

    if (prefixOut == NULL) return(NULL);
    *prefixOut = NULL;

    if (cur == NULL) return(NULL);

    /* nasty but well=formed */
    if (cur[0] == ':')
	return(xmlStrdup(name));

    c = *cur++;
    while ((c != 0) && (c != ':') && (len < max)) { /* tested bigname.xml */
	buf[len++] = c;
	c = *cur++;
    }
    if (len >= max) {
	/*
	 * Okay someone managed to make a huge name, so he's ready to pay
	 * for the processing speed.
	 */
	max = len * 2;

	buffer = xmlMalloc(max);
	if (buffer == NULL) {
	    xmlErrMemory(ctxt);
	    return(NULL);
	}
	memcpy(buffer, buf, len);
	while ((c != 0) && (c != ':')) { /* tested bigname.xml */
	    if (len + 10 > max) {
	        xmlChar *tmp;
                int newSize;

                newSize = xmlGrowCapacity(max, 1, 1, XML_MAX_ITEMS);
                if (newSize < 0) {
		    xmlErrMemory(ctxt);
		    xmlFree(buffer);
		    return(NULL);
                }
		tmp = xmlRealloc(buffer, newSize);
		if (tmp == NULL) {
		    xmlErrMemory(ctxt);
		    xmlFree(buffer);
		    return(NULL);
		}
		buffer = tmp;
		max = newSize;
	    }
	    buffer[len++] = c;
	    c = *cur++;
	}
	buffer[len] = 0;
    }

    if ((c == ':') && (*cur == 0)) {
        if (buffer != NULL)
	    xmlFree(buffer);
	return(xmlStrdup(name));
    }

    if (buffer == NULL) {
	ret = xmlStrndup(buf, len);
        if (ret == NULL) {
	    xmlErrMemory(ctxt);
	    return(NULL);
        }
    } else {
	ret = buffer;
	buffer = NULL;
	max = XML_MAX_NAMELEN;
    }


    if (c == ':') {
	c = *cur;
        prefix = ret;
	if (c == 0) {
	    ret = xmlStrndup(BAD_CAST "", 0);
            if (ret == NULL) {
                xmlFree(prefix);
                return(NULL);
            }
            *prefixOut = prefix;
            return(ret);
	}
	len = 0;

	/*
	 * Check that the first character is proper to start
	 * a new name
	 */
	if (!(((c >= 0x61) && (c <= 0x7A)) ||
	      ((c >= 0x41) && (c <= 0x5A)) ||
	      (c == '_') || (c == ':'))) {
	    int l;
	    int first = CUR_SCHAR(cur, l);

	    if (!IS_LETTER(first) && (first != '_')) {
		xmlFatalErrMsgStr(ctxt, XML_NS_ERR_QNAME,
			    "Name %s is not XML Namespace compliant\n",
				  name);
	    }
	}
	cur++;

	while ((c != 0) && (len < max)) { /* tested bigname2.xml */
	    buf[len++] = c;
	    c = *cur++;
	}
	if (len >= max) {
	    /*
	     * Okay someone managed to make a huge name, so he's ready to pay
	     * for the processing speed.
	     */
	    max = len * 2;

	    buffer = xmlMalloc(max);
	    if (buffer == NULL) {
	        xmlErrMemory(ctxt);
                xmlFree(prefix);
		return(NULL);
	    }
	    memcpy(buffer, buf, len);
	    while (c != 0) { /* tested bigname2.xml */
		if (len + 10 > max) {
		    xmlChar *tmp;
                    int newSize;

                    newSize = xmlGrowCapacity(max, 1, 1, XML_MAX_ITEMS);
                    if (newSize < 0) {
                        xmlErrMemory(ctxt);
                        xmlFree(buffer);
                        return(NULL);
                    }
		    tmp = xmlRealloc(buffer, newSize);
		    if (tmp == NULL) {
			xmlErrMemory(ctxt);
                        xmlFree(prefix);
			xmlFree(buffer);
			return(NULL);
		    }
		    buffer = tmp;
                    max = newSize;
		}
		buffer[len++] = c;
		c = *cur++;
	    }
	    buffer[len] = 0;
	}

	if (buffer == NULL) {
	    ret = xmlStrndup(buf, len);
            if (ret == NULL) {
                xmlFree(prefix);
                return(NULL);
            }
	} else {
	    ret = buffer;
	}

        *prefixOut = prefix;
    }

    return(ret);
}